

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

word Nf_MatchDeref_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM)

{
  bool bVar1;
  int iVar2;
  Nf_Mat_t *pNVar3;
  int *piVar4;
  int *piVar5;
  word wVar6;
  Mio_Cell2_t *pMVar7;
  int *pCut;
  int local_38;
  int fCompl;
  int iVar;
  int k;
  word Area;
  Nf_Mat_t *pM_local;
  int c_local;
  int i_local;
  Nf_Man_t *p_local;
  
  _iVar = 0;
  if (-1 < *(int *)pM) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x6a1,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
  }
  if ((*(uint *)pM >> 0x1e & 1) == 0) {
    iVar2 = Nf_ObjCutSetId(p,i);
    if (iVar2 == 0) {
      p_local = (Nf_Man_t *)0x0;
    }
    else {
      piVar4 = Nf_ObjCutSet(p,i);
      piVar4 = Nf_CutFromHandle(piVar4,*(uint *)pM >> 0x14 & 0x3ff);
      fCompl = 0;
      while( true ) {
        iVar2 = Nf_CutSize(piVar4);
        bVar1 = false;
        if (fCompl < iVar2) {
          piVar5 = Nf_CutLeaves(piVar4);
          iVar2 = Nf_CfgVar(pM->Cfg,fCompl);
          local_38 = piVar5[iVar2];
          bVar1 = false;
          if (local_38 != 0) {
            pCut._4_4_ = Nf_CfgCompl(pM->Cfg,fCompl);
            bVar1 = true;
          }
        }
        if (!bVar1) break;
        iVar2 = Nf_ObjMapRefNum(p,local_38,pCut._4_4_);
        if (iVar2 < 1) {
          __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x6ae,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
        }
        iVar2 = Nf_ObjMapRefDec(p,local_38,pCut._4_4_);
        if (iVar2 == 0) {
          pNVar3 = Nf_ObjMatchD(p,local_38,pCut._4_4_);
          wVar6 = Nf_MatchDeref_rec(p,local_38,pCut._4_4_,pNVar3);
          _iVar = wVar6 + _iVar;
        }
        fCompl = fCompl + 1;
      }
      pMVar7 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
      p_local = (Nf_Man_t *)(_iVar + pMVar7->AreaW);
    }
  }
  else {
    iVar2 = Nf_ObjMapRefNum(p,i,(uint)((c != 0 ^ 0xffU) & 1));
    if (iVar2 < 1) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x6a4,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
    }
    iVar2 = Nf_ObjMapRefDec(p,i,(uint)((c != 0 ^ 0xffU) & 1));
    if (iVar2 == 0) {
      pNVar3 = Nf_ObjMatchD(p,i,(uint)((c != 0 ^ 0xffU) & 1));
      _iVar = Nf_MatchDeref_rec(p,i,(uint)((c != 0 ^ 0xffU) & 1),pNVar3);
    }
    p_local = (Nf_Man_t *)(_iVar + p->InvAreaW);
  }
  return (word)p_local;
}

Assistant:

word Nf_MatchDeref_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM )
{
    word Area = 0;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    if ( pM->fCompl )
    {
        assert( Nf_ObjMapRefNum(p, i, !c) > 0 );
        if ( !Nf_ObjMapRefDec(p, i, !c) )
            Area += Nf_MatchDeref_rec( p, i, !c, Nf_ObjMatchD(p, i, !c) );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) > 0 );
        if ( !Nf_ObjMapRefDec(p, iVar, fCompl) )
            Area += Nf_MatchDeref_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl) );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}